

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::SSARewriter::PrintPhiCandidates(SSARewriter *this)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  BasicBlock *this_00;
  CFG *cfg;
  PhiCandidate *this_01;
  string local_50;
  reference local_30;
  value_type *phi_it;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>_>
  *__range2;
  SSARewriter *this_local;
  
  std::operator<<((ostream *)&std::cerr,"\nPhi candidates:\n");
  __end2 = std::
           unordered_map<unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>_>
           ::begin(&this->phi_candidates_);
  phi_it = (value_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>_>_>
           ::end(&this->phi_candidates_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false>
                         *)&phi_it);
    if (!bVar1) break;
    local_30 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false,_false>
               ::operator*(&__end2);
    poVar3 = std::operator<<((ostream *)&std::cerr,"\tBB %");
    this_00 = PhiCandidate::bb(&local_30->second);
    uVar2 = BasicBlock::id(this_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    poVar3 = std::operator<<(poVar3,": ");
    this_01 = &local_30->second;
    cfg = Pass::cfg(&this->pass_->super_Pass);
    PhiCandidate::PrettyPrint_abi_cxx11_(&local_50,this_01,cfg);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::SSARewriter::PhiCandidate>,_false,_false>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  return;
}

Assistant:

void SSARewriter::PrintPhiCandidates() const {
  std::cerr << "\nPhi candidates:\n";
  for (const auto& phi_it : phi_candidates_) {
    std::cerr << "\tBB %" << phi_it.second.bb()->id() << ": "
              << phi_it.second.PrettyPrint(pass_->cfg()) << "\n";
  }
  std::cerr << "\n";
}